

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

var __thiscall
cs_impl::runtime_cs_ext::wait_until
          (runtime_cs_ext *this,numeric *mill_sec,var *func,array *argument)

{
  longdouble lVar1;
  bool bVar2;
  char *pcVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined *puVar5;
  object_method *poVar6;
  callable *pcVar7;
  long *plVar8;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *this_00;
  size_t sVar9;
  initializer_list<cs_impl::any> __l;
  vector args_1;
  vector args;
  uint *local_108;
  long local_100;
  uint local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  vector local_e8;
  _Map_pointer ppaStack_d0;
  size_t local_c0;
  size_t local_b8;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> local_b0;
  _Elt_pointer local_98;
  _Elt_pointer paStack_90;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_78;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_58;
  
  if (func->mDat == (proxy *)0x0) {
    puVar5 = &void::typeinfo;
  }
  else {
    iVar4 = (*func->mDat->data->_vptr_baseHolder[2])();
    puVar5 = (undefined *)CONCAT44(extraout_var,iVar4);
  }
  pcVar3 = *(char **)(puVar5 + 8);
  if (pcVar3 == "N2cs8callableE") {
LAB_00192b9b:
    local_58._M_cur =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_cur;
    local_58._M_first =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_first;
    local_58._M_last =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_last;
    local_58._M_node =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_node;
    local_78._M_cur =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_finish._M_cur;
    local_78._M_first =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_finish._M_first;
    local_78._M_last =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_finish._M_last;
    local_78._M_node =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_finish._M_node;
    std::vector<cs_impl::any,std::allocator<cs_impl::any>>::
    vector<std::_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*>,void>
              ((vector<cs_impl::any,std::allocator<cs_impl::any>> *)&local_e8,&local_58,&local_78,
               (allocator_type *)&local_98);
    bVar2 = mill_sec->type;
    sVar9 = (mill_sec->data)._int;
    lVar1 = *(longdouble *)&mill_sec->data;
    pcVar7 = any::const_val<cs::callable>(func);
    local_c0 = (size_t)ROUND(lVar1);
    if (bVar2 == false) {
      sVar9 = local_c0;
    }
    wait_until_impl(this,sVar9,pcVar7,&local_e8);
    this_00 = &local_e8;
  }
  else {
    if (*pcVar3 != '*') {
      iVar4 = strcmp(pcVar3,"N2cs8callableE");
      if (iVar4 == 0) goto LAB_00192b9b;
    }
    if (func->mDat == (proxy *)0x0) {
      puVar5 = &void::typeinfo;
    }
    else {
      iVar4 = (*func->mDat->data->_vptr_baseHolder[2])();
      puVar5 = (undefined *)CONCAT44(extraout_var_00,iVar4);
    }
    pcVar3 = *(char **)(puVar5 + 8);
    if (pcVar3 != "N2cs13object_methodE") {
      if (*pcVar3 == '*') {
LAB_00192d6e:
        plVar8 = (long *)__cxa_allocate_exception(0x20);
        local_108 = &local_f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,"Invoke non-callable object.","");
        *plVar8 = (long)(plVar8 + 2);
        if (local_108 == &local_f8) {
          *(uint *)(plVar8 + 2) = local_f8;
          *(undefined4 *)((long)plVar8 + 0x14) = uStack_f4;
          *(undefined4 *)(plVar8 + 3) = uStack_f0;
          *(undefined4 *)((long)plVar8 + 0x1c) = uStack_ec;
        }
        else {
          *plVar8 = (long)local_108;
          plVar8[2] = CONCAT44(uStack_f4,local_f8);
        }
        plVar8[1] = local_100;
        local_100 = 0;
        local_f8 = local_f8 & 0xffffff00;
        local_108 = &local_f8;
        __cxa_throw(plVar8,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
      }
      iVar4 = strcmp(pcVar3,"N2cs13object_methodE");
      if (iVar4 != 0) goto LAB_00192d6e;
    }
    poVar6 = any::const_val<cs::object_method>(func);
    local_e8.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(poVar6->object).mDat;
    if ((proxy *)local_e8.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
                 super__Vector_impl_data._M_start != (proxy *)0x0) {
      ((proxy *)
      local_e8.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_start)->refcount =
           ((proxy *)
           local_e8.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
           super__Vector_impl_data._M_start)->refcount + 1;
    }
    __l._M_len = 1;
    __l._M_array = (iterator)&local_e8;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
              (&local_b0,__l,(allocator_type *)&local_98);
    any::recycle((any *)&local_e8);
    local_e8.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Vector_impl_data._M_start =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_cur;
    local_e8.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_first;
    local_e8.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_last;
    ppaStack_d0 = (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                  .super__Deque_impl_data._M_start._M_node;
    local_98 = (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
    paStack_90 = (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                 super__Deque_impl_data._M_finish._M_first;
    local_88 = *(undefined4 *)
                &(argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                 super__Deque_impl_data._M_finish._M_last;
    uStack_84 = *(undefined4 *)
                 ((long)&(argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                         _M_impl.super__Deque_impl_data._M_finish._M_last + 4);
    uStack_80 = *(undefined4 *)
                 &(argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                  .super__Deque_impl_data._M_finish._M_node;
    uStack_7c = *(undefined4 *)
                 ((long)&(argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                         _M_impl.super__Deque_impl_data._M_finish._M_node + 4);
    std::vector<cs_impl::any,std::allocator<cs_impl::any>>::
    _M_range_insert<std::_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*>>
              ((vector<cs_impl::any,std::allocator<cs_impl::any>> *)&local_b0,
               local_b0.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_e8);
    bVar2 = mill_sec->type;
    sVar9 = (mill_sec->data)._int;
    lVar1 = *(longdouble *)&mill_sec->data;
    pcVar7 = any::const_val<cs::callable>(&poVar6->callable);
    local_b8 = (size_t)ROUND(lVar1);
    if (bVar2 == false) {
      sVar9 = local_b8;
    }
    wait_for_impl(this,sVar9,pcVar7,&local_b0);
    this_00 = &local_b0;
  }
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(this_00);
  return (var)(proxy *)this;
}

Assistant:

cs::var wait_until(const cs::numeric& mill_sec, const cs::var &func, const cs::array &argument)
		{
			if (func.type() == typeid(cs::callable)) {
				cs::vector args(argument.begin(), argument.end());
				return wait_until_impl(mill_sec.as_integer(), func.const_val<cs::callable>(), args);
			}
			else if (func.type() == typeid(cs::object_method)) {
				const auto &om = func.const_val<cs::object_method>();
				cs::vector args{om.object};
				args.insert(args.end(), argument.begin(), argument.end());
				return wait_for_impl(mill_sec.as_integer(), om.callable.const_val<cs::callable>(), args);
			}
			else
				throw cs::lang_error("Invoke non-callable object.");
		}